

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
          (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *this,
          SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *other)

{
  int iVar1;
  ValueLength __n;
  ValueLength VVar2;
  
  if (*(char **)this == *(char **)other) {
    return true;
  }
  if (**(char **)this == **(char **)other) {
    __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this);
    VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize(other);
    if (__n == VVar2) {
      iVar1 = bcmp(*(void **)this,*(void **)other,__n);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }